

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int X509_check_ip_asc(X509 *x,char *ipasc,uint flags)

{
  uint uVar1;
  int iVar2;
  uchar ipout [16];
  uint8_t auStack_28 [16];
  
  iVar2 = -2;
  if (ipasc != (char *)0x0) {
    uVar1 = x509v3_a2i_ipadd(auStack_28,ipasc);
    if (uVar1 != 0) {
      iVar2 = do_x509_check(x,(char *)auStack_28,(ulong)uVar1,flags,7,(char **)0x0);
    }
  }
  return iVar2;
}

Assistant:

int X509_check_ip_asc(const X509 *x, const char *ipasc, unsigned int flags) {
  unsigned char ipout[16];
  size_t iplen;

  if (ipasc == NULL) {
    return -2;
  }
  iplen = (size_t)x509v3_a2i_ipadd(ipout, ipasc);
  if (iplen == 0) {
    return -2;
  }
  return do_x509_check(x, (const char *)ipout, iplen, flags, GEN_IPADD, NULL);
}